

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O0

int32 best_rem_score(ps_astar_t *nbest,ps_latnode_t *from)

{
  long lVar1;
  int32 iVar2;
  int32 local_34;
  int local_30;
  int32 n_used;
  int32 score;
  int32 bestscore;
  latlink_list_t *x;
  ps_latnode_t *from_local;
  ps_astar_t *nbest_local;
  
  if ((from->info).fanin < 1) {
    nbest_local._4_4_ = (from->info).fanin;
  }
  else {
    n_used = -0x20000000;
    x = (latlink_list_t *)from;
    from_local = (ps_latnode_t *)nbest;
    for (_score = from->exits; _score != (latlink_list_t *)0x0; _score = _score->next) {
      iVar2 = best_rem_score((ps_astar_t *)from_local,_score->link->to);
      local_30 = _score->link->ascr + iVar2;
      lVar1._0_4_ = from_local->basewid;
      lVar1._4_4_ = from_local->fef;
      if (lVar1 != 0) {
        iVar2 = ngram_bg_score(*(ngram_model_t **)&from_local->basewid,_score->link->to->basewid,
                               *(int32 *)&x->next,&local_34);
        local_30 = (int)((float)(iVar2 >> 10) * (float)from_local->lef + (float)local_30);
      }
      if (n_used < local_30) {
        n_used = local_30;
      }
    }
    *(int32 *)&x[2].link = n_used;
    nbest_local._4_4_ = n_used;
  }
  return nbest_local._4_4_;
}

Assistant:

static int32
best_rem_score(ps_astar_t *nbest, ps_latnode_t * from)
{
    latlink_list_t *x;
    int32 bestscore, score;

    if (from->info.rem_score <= 0)
        return (from->info.rem_score);

    /* Best score from "from" to end of utt not known; compute from successors */
    bestscore = WORST_SCORE;
    for (x = from->exits; x; x = x->next) {
        int32 n_used;

        score = best_rem_score(nbest, x->link->to);
        score += x->link->ascr;
        if (nbest->lmset)
            score += (ngram_bg_score(nbest->lmset, x->link->to->basewid,
                                     from->basewid, &n_used) >> SENSCR_SHIFT)
                      * nbest->lwf;
        if (score BETTER_THAN bestscore)
            bestscore = score;
    }
    from->info.rem_score = bestscore;

    return bestscore;
}